

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall gmath::OrthoCamera::setPart(OrthoCamera *this,long x,long y,long w,long h)

{
  double *pdVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  Camera *in_RDI;
  long in_R8;
  Vector3d *TT;
  double dVar2;
  Vector3d T;
  Camera *this_00;
  SVector<double,_3> *in_stack_ffffffffffffffa8;
  SVector<double,_3> *in_stack_ffffffffffffffb0;
  _func_int **pp_Var3;
  SVector<double,_3> local_40;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Camera::setPart(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  Camera::getT(in_RDI);
  SVector<double,_3>::SVector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  TT = (Vector3d *)(double)local_10;
  this_00 = (Camera *)in_RDI[1]._vptr_Camera;
  pdVar1 = SVector<double,_3>::operator[](&local_40,0);
  *pdVar1 = (double)TT * (double)this_00 + *pdVar1;
  dVar2 = (double)local_18;
  pp_Var3 = in_RDI[1]._vptr_Camera;
  pdVar1 = SVector<double,_3>::operator[](&local_40,1);
  *pdVar1 = -dVar2 * (double)pp_Var3 + *pdVar1;
  Camera::setT(this_00,TT);
  return;
}

Assistant:

void OrthoCamera::setPart(long x, long y, long w, long h)
{
  Camera::setPart(x, y, w, h);

  Vector3d T=getT();

  T[0]+=x*res;
  T[1]-=y*res;

  setT(T);
}